

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

reference __thiscall
slang::SmallVectorBase<slang::ast::HierarchicalReference::Element>::
emplace_back<slang::ast::InstanceArraySymbol&,std::pair<int,int>>
          (SmallVectorBase<slang::ast::HierarchicalReference::Element> *this,
          InstanceArraySymbol *args,pair<int,_int> *args_1)

{
  size_type sVar1;
  pointer pEVar2;
  
  if (this->len == this->cap) {
    pEVar2 = emplaceRealloc<slang::ast::InstanceArraySymbol&,std::pair<int,int>>
                       (this,this->data_ + this->len,args,args_1);
    return pEVar2;
  }
  ast::HierarchicalReference::Element::Element(this->data_ + this->len,&args->super_Symbol,*args_1);
  sVar1 = this->len;
  this->len = sVar1 + 1;
  return this->data_ + sVar1;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }